

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalMapping::CheckTypeAndMergeFrom
          (CategoricalMapping *this,MessageLite *from)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ValueOnUnknownUnion VVar4;
  LogMessage *other;
  Int64ToStringMap *this_00;
  StringToInt64Map *this_01;
  undefined8 *puVar5;
  undefined1 *puVar6;
  Arena *pAVar7;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__CategoricalMapping_004908a8) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::CategoricalMapping *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((CategoricalMapping *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/CategoricalMapping.pb.cc"
               ,399);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  iVar1 = *(int *)((long)&from[2]._vptr_MessageLite + 4);
  if (iVar1 != 1) {
    if (iVar1 != 2) goto LAB_0031e2fa;
    if (this->_oneof_case_[0] == 2) {
      this_00 = (this->MappingType_).int64tostringmap_;
LAB_0031e29f:
      puVar6 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_MappingType(this);
      this->_oneof_case_[0] = 2;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64ToStringMap>
                          (pAVar7);
      (this->MappingType_).int64tostringmap_ = this_00;
      if (*(int *)((long)&from[2]._vptr_MessageLite + 4) == 2) goto LAB_0031e29f;
      puVar6 = _Int64ToStringMap_default_instance_;
    }
    Int64ToStringMap::MergeFrom(this_00,(Int64ToStringMap *)puVar6);
    goto LAB_0031e2fa;
  }
  if (this->_oneof_case_[0] == 1) {
    this_01 = (this->MappingType_).stringtoint64map_;
LAB_0031e2da:
    puVar6 = (undefined1 *)from[1]._vptr_MessageLite;
  }
  else {
    clear_MappingType(this);
    this->_oneof_case_[0] = 1;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringToInt64Map>
                        (pAVar7);
    (this->MappingType_).stringtoint64map_ = this_01;
    if (*(int *)((long)&from[2]._vptr_MessageLite + 4) == 1) goto LAB_0031e2da;
    puVar6 = _StringToInt64Map_default_instance_;
  }
  StringToInt64Map::MergeFrom(this_01,(StringToInt64Map *)puVar6);
LAB_0031e2fa:
  iVar1 = (int)from[2]._internal_metadata_.ptr_;
  if (iVar1 == 0x66) {
    VVar4 = (ValueOnUnknownUnion)from[1]._internal_metadata_.ptr_;
    if (this->_oneof_case_[1] != 0x66) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x66;
    }
    this->ValueOnUnknown_ = VVar4;
  }
  else if (iVar1 == 0x65) {
    uVar2 = from[1]._internal_metadata_.ptr_;
    if (this->_oneof_case_[1] != 0x65) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x65;
      (this->ValueOnUnknown_).int64value_ =
           (int64_t)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ValueOnUnknown_,uVar2 & 0xfffffffffffffffe,puVar5);
  }
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}